

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locid.cpp
# Opt level: O0

void __thiscall
icu_63::KeywordEnumeration::KeywordEnumeration
          (KeywordEnumeration *this,char *keys,int32_t keywordLen,int32_t currentIndex,
          UErrorCode *status)

{
  UBool UVar1;
  char *pcVar2;
  UErrorCode *status_local;
  int32_t currentIndex_local;
  int32_t keywordLen_local;
  char *keys_local;
  KeywordEnumeration *this_local;
  
  StringEnumeration::StringEnumeration(&this->super_StringEnumeration);
  (this->super_StringEnumeration).super_UObject._vptr_UObject =
       (_func_int **)&PTR__KeywordEnumeration_004b0d48;
  this->keywords = "";
  this->current = "";
  this->length = 0;
  UnicodeString::UnicodeString(&this->currUSKey);
  UVar1 = ::U_SUCCESS(*status);
  if ((UVar1 != '\0') && (keywordLen != 0)) {
    if ((keys == (char *)0x0) || (keywordLen < 0)) {
      *status = U_ILLEGAL_ARGUMENT_ERROR;
    }
    else {
      pcVar2 = (char *)uprv_malloc_63((long)(keywordLen + 1));
      this->keywords = pcVar2;
      if (this->keywords == (char *)0x0) {
        *status = U_MEMORY_ALLOCATION_ERROR;
      }
      else {
        memcpy(this->keywords,keys,(long)keywordLen);
        this->keywords[keywordLen] = '\0';
        this->current = this->keywords + currentIndex;
        this->length = keywordLen;
      }
    }
  }
  return;
}

Assistant:

KeywordEnumeration(const char *keys, int32_t keywordLen, int32_t currentIndex, UErrorCode &status)
        : keywords((char *)&fgClassID), current((char *)&fgClassID), length(0) {
        if(U_SUCCESS(status) && keywordLen != 0) {
            if(keys == NULL || keywordLen < 0) {
                status = U_ILLEGAL_ARGUMENT_ERROR;
            } else {
                keywords = (char *)uprv_malloc(keywordLen+1);
                if (keywords == NULL) {
                    status = U_MEMORY_ALLOCATION_ERROR;
                }
                else {
                    uprv_memcpy(keywords, keys, keywordLen);
                    keywords[keywordLen] = 0;
                    current = keywords + currentIndex;
                    length = keywordLen;
                }
            }
        }
    }